

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::CreateNodes
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiNode *pParent)

{
  value_type paVar1;
  bool bVar2;
  reference ppVar3;
  size_type sVar4;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  reference ppaVar7;
  aiNode **ppaVar8;
  aiNode *paVar9;
  reference ppaVar10;
  aiNode *pNode_1;
  size_t i_1;
  aiMesh *pMesh_1;
  size_t i;
  aiNode *pNode;
  aiMesh *pMesh;
  size_t local_80;
  size_t numVerts;
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *pArray;
  _Self local_68;
  FaceMapIt it;
  vector<aiNode_*,_std::allocator<aiNode_*>_> NodeArray;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  uint matIdx;
  aiNode *pParent_local;
  aiScene *pScene_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  if (pModel != (Q3BSPModel *)0x0) {
    MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
         ::begin(&this->m_MaterialLookupMap);
    while( true ) {
      pArray = (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
               ::end(&this->m_MaterialLookupMap);
      bVar2 = std::operator!=(&local_68,(_Self *)&pArray);
      if (!bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>
               ::operator*(&local_68);
      numVerts = (size_t)ppVar3->second;
      local_80 = countData(this,(vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                 *)numVerts);
      if (local_80 != 0) {
        pNode = (aiNode *)0x0;
        i = (size_t)CreateTopology(this,pModel,
                                   MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                    *)numVerts,(aiMesh **)&pNode);
        if ((aiNode *)i != (aiNode *)0x0) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it,(value_type *)&i);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                     &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)&pNode);
        }
      }
      MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>
      ::operator++(&local_68);
    }
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pScene->mNumMeshes = (uint)sVar4;
    if (pScene->mNumMeshes != 0) {
      ppaVar5 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
      pScene->mMeshes = ppaVar5;
      for (pMesh_1 = (aiMesh *)0x0;
          paVar6 = (aiMesh *)
                   std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                              &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), pMesh_1 < paVar6;
          pMesh_1 = (aiMesh *)((long)&pMesh_1->mPrimitiveTypes + 1)) {
        ppaVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                             &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pMesh_1);
        if (*ppaVar7 != (value_type)0x0) {
          pScene->mMeshes[(long)pMesh_1] = *ppaVar7;
        }
      }
    }
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pParent->mNumChildren = (uint)sVar4;
    ppaVar8 = (aiNode **)operator_new__((ulong)pScene->mRootNode->mNumChildren << 3);
    pParent->mChildren = ppaVar8;
    for (pNode_1 = (aiNode *)0x0;
        paVar9 = (aiNode *)
                 std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it), pNode_1 < paVar9;
        pNode_1 = (aiNode *)((long)&(pNode_1->mName).length + 1)) {
      ppaVar10 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it,(size_type)pNode_1);
      paVar1 = *ppaVar10;
      paVar1->mParent = pParent;
      pParent->mChildren[(long)pNode_1] = paVar1;
      *pParent->mChildren[(long)pNode_1]->mMeshes = (uint)pNode_1;
    }
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&it);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &NodeArray.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Q3BSPFileImporter::CreateNodes( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
        aiNode *pParent ) {
    if ( nullptr == pModel ) {
        return;
    }

    unsigned int matIdx( 0 );
    std::vector<aiMesh*> MeshArray;
    std::vector<aiNode*> NodeArray;
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        std::vector<Q3BSP::sQ3BSPFace*> *pArray = (*it).second;
        size_t numVerts = countData( *pArray );
        if ( 0 != numVerts ) {
            aiMesh *pMesh( nullptr );
            aiNode *pNode = CreateTopology( pModel, matIdx, *pArray, &pMesh );
            if ( nullptr != pNode ) {
                NodeArray.push_back( pNode );
                MeshArray.push_back( pMesh );
            }
        }
        matIdx++;
    }

    pScene->mNumMeshes = static_cast<unsigned int>( MeshArray.size() );
    if ( pScene->mNumMeshes > 0 ) {
        pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];
        for ( size_t i = 0; i < MeshArray.size(); i++ ) {
            aiMesh *pMesh = MeshArray[ i ];
            if ( nullptr != pMesh ) {
                pScene->mMeshes[ i ] = pMesh;
            }
        }
    }

    pParent->mNumChildren = static_cast<unsigned int>(MeshArray.size());
    pParent->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    for ( size_t i=0; i<NodeArray.size(); i++ ) {
        aiNode *pNode = NodeArray[ i ];
        pNode->mParent = pParent;
        pParent->mChildren[ i ] = pNode;
        pParent->mChildren[ i ]->mMeshes[ 0 ] = static_cast<unsigned int>(i);
    }
}